

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix3.hpp
# Opt level: O0

void __thiscall
OpenMD::SquareMatrix3<double>::setupSkewMat
          (SquareMatrix3<double> *this,double v1,double v2,double v3)

{
  double v3_local;
  double v2_local;
  double v1_local;
  SquareMatrix3<double> *this_local;
  
  (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
  (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][1] = -v3;
  (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][2] = v2;
  (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1][0] = v3;
  (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1][1] = 0.0;
  (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1][2] = -v1;
  (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][0] = -v2;
  (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][1] = v1;
  (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][2] = 0.0;
  return;
}

Assistant:

void setupSkewMat(Real v1, Real v2, Real v3) {
      this->data_[0][0] = 0;
      this->data_[0][1] = -v3;
      this->data_[0][2] = v2;
      this->data_[1][0] = v3;
      this->data_[1][1] = 0;
      this->data_[1][2] = -v1;
      this->data_[2][0] = -v2;
      this->data_[2][1] = v1;
      this->data_[2][2] = 0;
    }